

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

void remove_short_regions(REGIONS *regions,int *num_regions,REGION_TYPES type,int length)

{
  long lVar1;
  int k;
  
  k = 0;
  while ((k < *num_regions && (1 < *num_regions))) {
    lVar1 = (long)k;
    if (((regions[lVar1].last - regions[lVar1].start) + 1 < length) && (regions[lVar1].type == type)
       ) {
      remove_region(2,regions,num_regions,&k);
    }
    else {
      k = k + 1;
    }
  }
  cleanup_regions(regions,num_regions);
  return;
}

Assistant:

static void remove_short_regions(REGIONS *regions, int *num_regions,
                                 REGION_TYPES type, int length) {
  int k = 0;
  while (k < *num_regions && (*num_regions) > 1) {
    if ((regions[k].last - regions[k].start + 1 < length &&
         regions[k].type == type)) {
      // merge current region with the previous and next regions
      remove_region(2, regions, num_regions, &k);
    } else {
      k++;
    }
  }
  cleanup_regions(regions, num_regions);
}